

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Button.cpp
# Opt level: O2

void __thiscall gui::Button::handleMouseRelease(Button *this,Button button,Vector2f *mouseParent)

{
  Vector2f mouseLocal;
  Vector2f local_20;
  
  local_20 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
  if (((int)button < 3) && (this->isPressed_ == true)) {
    setPressed(this,false);
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              (&this->onClick,&this->super_Widget,&local_20);
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMouseRelease,&this->super_Widget,button,&local_20);
  Widget::handleMouseRelease(&this->super_Widget,button,mouseParent);
  return;
}

Assistant:

void Button::handleMouseRelease(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle && isPressed_) {
        setPressed(false);
        onClick.emit(this, mouseLocal);
    }
    onMouseRelease.emit(this, button, mouseLocal);
    baseClass::handleMouseRelease(button, mouseParent);
}